

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O0

_Bool xdr_nreplymsg(XDR *xdrs,rpc_msg *rmsg)

{
  _Bool _Var1;
  uint uVar2;
  bool_t bVar3;
  rpc_msg *rmsg_local;
  XDR *xdrs_local;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x90,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  if (rmsg != (rpc_msg *)0x0) {
    _Var1 = xdr_u_int32_t(xdrs,&rmsg->rm_xid);
    if (((_Var1) && (uVar2 = xdr_enum((XDR *)xdrs,(enum_t *)&rmsg->rm_direction), (uVar2 & 1) != 0))
       && (rmsg->rm_direction == REPLY)) {
      bVar3 = xdr_union((XDR *)xdrs,(enum_t *)&(rmsg->ru).RM_rmb,(char *)&(rmsg->ru).RM_rmb.ru,
                        (xdr_discrim *)reply_dscrm,(xdrproc_t)0x0);
      xdrs_local._7_1_ = (_Bool)((byte)bVar3 & 1);
    }
    else {
      xdrs_local._7_1_ = false;
    }
    return xdrs_local._7_1_;
  }
  __assert_fail("rmsg != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0x91,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
}

Assistant:

bool
xdr_nreplymsg(XDR *xdrs, struct rpc_msg *rmsg)
{
	assert(xdrs != NULL);
	assert(rmsg != NULL);

	if (inline_xdr_u_int32_t(xdrs, &(rmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(rmsg->rm_direction))
	    && (rmsg->rm_direction == REPLY))
		return (inline_xdr_union(xdrs,
					 (enum_t *)&(rmsg->rm_reply.rp_stat),
					 (void *)&(rmsg->rm_reply.ru),
					 reply_dscrm, NULL_xdrproc_t));
	return (false);
}